

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRD2File.cpp
# Opt level: O0

void __thiscall BRD2File::BRD2File(BRD2File *this,vector<char,_std::allocator<char>_> *buf)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __last;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __first;
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  void *pvVar5;
  reference ppcVar6;
  byte *pbVar7;
  long lVar8;
  char *pcVar9;
  mapped_type *ppcVar10;
  pointer ppVar11;
  ostream *poVar12;
  size_type sVar13;
  ulong uVar14;
  size_type sVar15;
  BRDPart *pBVar16;
  reference pvVar17;
  reference pvVar18;
  vector<char,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  BRDPart part_1;
  int i_1;
  bool isDIP;
  size_type i;
  int cpi;
  int pei;
  bool nail_is_top;
  iterator inet;
  int netid_1;
  BRDNail nail;
  out_of_range *e;
  uint side_1;
  int netid;
  BRDPin pin;
  int side;
  BRDPart part;
  int id;
  BRDPoint point;
  char *s;
  char *p;
  char *line;
  iterator __end1;
  iterator __begin1;
  vector<char_*,_std::allocator<char_*>_> *__range1;
  vector<char_*,_std::allocator<char_*>_> lines;
  int current_block;
  char *arena_end;
  char *arena;
  size_t file_buf_size;
  BRDPoint max;
  uint num_nets;
  unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
  nets;
  size_type buffer_size;
  unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
  *in_stack_ffffffffffffea18;
  undefined4 in_stack_ffffffffffffea20;
  undefined4 in_stack_ffffffffffffea24;
  int in_stack_ffffffffffffea28;
  uint in_stack_ffffffffffffea2c;
  BRDPart *in_stack_ffffffffffffea30;
  undefined4 in_stack_ffffffffffffea38;
  undefined4 in_stack_ffffffffffffea3c;
  undefined4 in_stack_ffffffffffffea40;
  undefined4 in_stack_ffffffffffffea44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea50;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 in_stack_ffffffffffffea68;
  BRDFileBase *in_stack_ffffffffffffea70;
  anon_class_16_2_d7082a65 *in_stack_ffffffffffffeb60;
  int local_1330;
  BRDPart *local_1328;
  int local_1320;
  uint local_131c;
  string local_1318 [39];
  undefined1 local_12f1 [33];
  string local_12d0 [32];
  string local_12b0 [32];
  string local_1290 [32];
  string local_1270 [32];
  string local_1250 [32];
  string local_1230 [32];
  string local_1210 [32];
  string local_11f0 [39];
  allocator<char> local_11c9;
  string local_11c8 [32];
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  string local_1108 [32];
  undefined1 local_10e8 [71];
  allocator<char> local_10a1;
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [39];
  allocator<char> local_f79;
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [39];
  allocator<char> local_e51;
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  byte **local_d50;
  undefined1 local_d39;
  _Node_iterator_base<std::pair<const_int,_char_*>,_false> local_d38;
  _Node_iterator_base<std::pair<const_int,_char_*>,_false> local_d30;
  byte **local_d28;
  uint local_d14;
  byte **local_d10;
  uint local_d00;
  undefined4 local_cfc;
  int local_cf8;
  undefined4 local_cf4;
  char *local_cf0;
  string local_ce8 [39];
  allocator<char> local_cc1;
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [40];
  byte **local_bb8;
  uint local_ba4;
  byte **local_ba0;
  uint local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined4 local_b7c;
  uint local_b78;
  mapped_type local_b70;
  string local_b50 [39];
  allocator<char> local_b29;
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  anon_class_16_2_d7082a65 local_a48 [2];
  byte **local_a28;
  uint local_a14;
  byte **local_a10;
  byte **local_a00;
  undefined1 *local_9f8;
  long *local_9f0;
  undefined1 **local_9e8;
  char *local_9e0;
  uint local_9b8;
  undefined4 local_9b4;
  uint local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  string local_998 [39];
  allocator<char> local_971;
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  byte **local_870;
  undefined1 *local_868;
  long *local_860;
  undefined1 **local_858;
  byte **local_850;
  uint local_83c;
  string local_838 [39];
  allocator<char> local_811;
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [39];
  allocator<char> local_6e9;
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [39];
  allocator<char> local_5c1;
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  BRDPoint local_4c0;
  string local_4b8 [39];
  allocator<char> local_491;
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  byte **local_390;
  byte **local_380;
  byte **local_370;
  byte **local_360;
  byte **local_350;
  undefined1 local_340 [8];
  byte *local_338;
  byte *local_330;
  char **local_328;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_320;
  undefined1 *local_318;
  undefined1 local_310 [28];
  int local_2f4;
  undefined1 *local_2f0;
  long local_2e8;
  char *local_2e0;
  char *local_2d8;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  size_t local_1a8;
  undefined4 local_19c;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [52];
  BRDPoint local_5c;
  uint local_54;
  size_type local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  BRDFileBase::BRDFileBase(in_stack_ffffffffffffea70);
  *in_RDI = &PTR__BRD2File_00302ec0;
  local_18 = std::vector<char,_std::allocator<char>_>::size(local_10);
  std::
  unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
  ::unordered_map((unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                   *)0x164eb0);
  local_54 = 0;
  BRDPoint::BRDPoint(&local_5c,0,0);
  iVar3 = (int)((ulong)in_stack_ffffffffffffea68 >> 0x20);
  if (local_18 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
               (allocator<char> *)in_stack_ffffffffffffea50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                   (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
    std::__cxx11::to_string(iVar3);
    std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                   (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                   (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                   (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                   (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                   (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
    std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
    uVar4 = std::__cxx11::string::c_str();
    SDL_LogError(1,"%s",uVar4);
    local_19c = 1;
  }
  else {
    local_1a8 = (local_18 + 1) * 3;
    pvVar5 = calloc(1,local_1a8);
    iVar3 = (int)((ulong)in_stack_ffffffffffffea68 >> 0x20);
    in_RDI[0x17] = pvVar5;
    if (in_RDI[0x17] == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                 (allocator<char> *)in_stack_ffffffffffffea50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                     (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
      std::__cxx11::to_string(iVar3);
      std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                     (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                     (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                     (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                     (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                     (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
      std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_1c8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      uVar4 = std::__cxx11::string::c_str();
      SDL_LogError(1,"%s",uVar4);
      local_19c = 1;
    }
    else {
      local_2d8 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_ffffffffffffea18);
      local_2e0 = (char *)std::vector<char,_std::allocator<char>_>::end
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_ffffffffffffea18);
      __first._M_current._4_4_ = in_stack_ffffffffffffea44;
      __first._M_current._0_4_ = in_stack_ffffffffffffea40;
      __last._M_current._4_4_ = in_stack_ffffffffffffea3c;
      __last._M_current._0_4_ = in_stack_ffffffffffffea38;
      std::copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*>
                (__first,__last,(char *)in_stack_ffffffffffffea30);
      *(undefined1 *)(in_RDI[0x17] + local_18) = 0;
      local_2e8 = local_18 + 1 + in_RDI[0x17];
      local_2f0 = (undefined1 *)(in_RDI[0x17] + -1 + local_1a8);
      *local_2f0 = 0;
      local_2f4 = 0;
      std::vector<char_*,_std::allocator<char_*>_>::vector
                ((vector<char_*,_std::allocator<char_*>_> *)0x1656a5);
      stringfile((char *)CONCAT44(in_stack_ffffffffffffea44,in_stack_ffffffffffffea40),
                 (vector<char_*,_std::allocator<char_*>_> *)
                 CONCAT44(in_stack_ffffffffffffea3c,in_stack_ffffffffffffea38));
      local_318 = local_310;
      local_320._M_current =
           (char **)std::vector<char_*,_std::allocator<char_*>_>::begin
                              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffea18)
      ;
      local_328 = (char **)std::vector<char_*,_std::allocator<char_*>_>::end
                                     ((vector<char_*,_std::allocator<char_*>_> *)
                                      in_stack_ffffffffffffea18);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                            *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20),
                           (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                            *)in_stack_ffffffffffffea18);
        iVar3 = (int)((ulong)in_stack_ffffffffffffea68 >> 0x20);
        if (!bVar1) break;
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
                  operator*(&local_320);
        local_330 = (byte *)*ppcVar6;
        while (iVar3 = isspace((uint)*local_330), iVar3 != 0) {
          local_330 = local_330 + 1;
        }
        if (*local_330 != 0) {
          local_338 = local_330;
          pbVar7 = (byte *)strstr((char *)local_330,"BRDOUT:");
          if (pbVar7 == local_330) {
            local_2f4 = 1;
            local_338 = local_338 + 7;
            local_350 = &local_338;
            uVar2 = BRD2File::anon_class_16_2_d7082a65::operator()(in_stack_ffffffffffffeb60);
            *(uint *)(in_RDI + 1) = uVar2;
            lVar8 = strtol((char *)local_338,(char **)&local_338,10);
            local_5c.x = (int)lVar8;
            lVar8 = strtol((char *)local_338,(char **)&local_338,10);
            local_5c.y = (int)lVar8;
          }
          else {
            pbVar7 = (byte *)strstr((char *)local_330,"NETS:");
            if (pbVar7 == local_330) {
              local_2f4 = 2;
              local_338 = local_338 + 5;
              local_360 = &local_338;
              local_54 = BRD2File::anon_class_16_2_d7082a65::operator()(in_stack_ffffffffffffeb60);
            }
            else {
              pbVar7 = (byte *)strstr((char *)local_330,"PARTS:");
              if (pbVar7 == local_330) {
                local_2f4 = 3;
                local_338 = local_338 + 6;
                local_370 = &local_338;
                uVar2 = BRD2File::anon_class_16_2_d7082a65::operator()(in_stack_ffffffffffffeb60);
                *(uint *)((long)in_RDI + 0xc) = uVar2;
              }
              else {
                pbVar7 = (byte *)strstr((char *)local_330,"PINS:");
                if (pbVar7 == local_330) {
                  local_2f4 = 4;
                  local_338 = local_338 + 5;
                  local_380 = &local_338;
                  uVar2 = BRD2File::anon_class_16_2_d7082a65::operator()(in_stack_ffffffffffffeb60);
                  *(uint *)(in_RDI + 2) = uVar2;
                }
                else {
                  pbVar7 = (byte *)strstr((char *)local_330,"NAILS:");
                  if (pbVar7 == local_330) {
                    local_2f4 = 5;
                    local_338 = local_338 + 6;
                    local_390 = &local_338;
                    uVar2 = BRD2File::anon_class_16_2_d7082a65::operator()
                                      (in_stack_ffffffffffffeb60);
                    *(uint *)((long)in_RDI + 0x14) = uVar2;
                  }
                  else {
                    switch(local_2f4) {
                    case 1:
                      sVar13 = std::vector<BRDPoint,_std::allocator<BRDPoint>_>::size
                                         ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                          (in_RDI + 3));
                      if (*(uint *)(in_RDI + 1) <= sVar13) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                                   (allocator<char> *)in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
                        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_3b0);
                        std::__cxx11::string::~string(local_3b0);
                        std::__cxx11::string::~string(local_3d0);
                        std::__cxx11::string::~string(local_3f0);
                        std::__cxx11::string::~string(local_410);
                        std::__cxx11::string::~string(local_430);
                        std::__cxx11::string::~string(local_450);
                        std::__cxx11::string::~string(local_4b8);
                        std::__cxx11::string::~string(local_470);
                        std::__cxx11::string::~string(local_490);
                        std::allocator<char>::~allocator(&local_491);
                        uVar4 = std::__cxx11::string::c_str();
                        SDL_LogError(1,"%s",uVar4);
                      }
                      BRDPoint::BRDPoint(&local_4c0);
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_4c0.x = (int)lVar8;
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_4c0.y = (int)lVar8;
                      if (local_5c.x < local_4c0.x) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                                   (allocator<char> *)in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
                        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_4e0);
                        std::__cxx11::string::~string(local_4e0);
                        std::__cxx11::string::~string(local_500);
                        std::__cxx11::string::~string(local_520);
                        std::__cxx11::string::~string(local_540);
                        std::__cxx11::string::~string(local_560);
                        std::__cxx11::string::~string(local_580);
                        std::__cxx11::string::~string(local_5e8);
                        std::__cxx11::string::~string(local_5a0);
                        std::__cxx11::string::~string(local_5c0);
                        std::allocator<char>::~allocator(&local_5c1);
                        uVar4 = std::__cxx11::string::c_str();
                        SDL_LogError(1,"%s",uVar4);
                      }
                      if (local_5c.y < local_4c0.y) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                                   (allocator<char> *)in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
                        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_608);
                        std::__cxx11::string::~string(local_608);
                        std::__cxx11::string::~string(local_628);
                        std::__cxx11::string::~string(local_648);
                        std::__cxx11::string::~string(local_668);
                        std::__cxx11::string::~string(local_688);
                        std::__cxx11::string::~string(local_6a8);
                        std::__cxx11::string::~string(local_710);
                        std::__cxx11::string::~string(local_6c8);
                        std::__cxx11::string::~string(local_6e8);
                        std::allocator<char>::~allocator(&local_6e9);
                        uVar4 = std::__cxx11::string::c_str();
                        SDL_LogError(1,"%s",uVar4);
                      }
                      std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                                ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                 in_stack_ffffffffffffea30,
                                 (value_type *)
                                 CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28));
                      break;
                    case 2:
                      sVar15 = std::
                               unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                               ::size((unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                                       *)0x166547);
                      if (local_54 <= sVar15) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                                   (allocator<char> *)in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
                        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_730);
                        std::__cxx11::string::~string(local_730);
                        std::__cxx11::string::~string(local_750);
                        std::__cxx11::string::~string(local_770);
                        std::__cxx11::string::~string(local_790);
                        std::__cxx11::string::~string(local_7b0);
                        std::__cxx11::string::~string(local_7d0);
                        std::__cxx11::string::~string(local_838);
                        std::__cxx11::string::~string(local_7f0);
                        std::__cxx11::string::~string(local_810);
                        std::allocator<char>::~allocator(&local_811);
                        uVar4 = std::__cxx11::string::c_str();
                        SDL_LogError(1,"%s",uVar4);
                      }
                      local_850 = &local_338;
                      local_83c = BRD2File::anon_class_16_2_d7082a65::operator()
                                            (in_stack_ffffffffffffeb60);
                      local_870 = &local_338;
                      local_868 = local_340;
                      local_860 = &local_2e8;
                      local_858 = &local_2f0;
                      pcVar9 = BRD2File::anon_class_32_4_fa413470::operator()
                                         ((anon_class_32_4_fa413470 *)
                                          CONCAT44(in_stack_ffffffffffffea24,
                                                   in_stack_ffffffffffffea20));
                      ppcVar10 = std::
                                 unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                                 ::operator[]((unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                                               *)CONCAT44(in_stack_ffffffffffffea24,
                                                          in_stack_ffffffffffffea20),
                                              (key_type *)in_stack_ffffffffffffea18);
                      *ppcVar10 = pcVar9;
                      break;
                    case 3:
                      sVar13 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                                         ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9))
                      ;
                      if (*(uint *)((long)in_RDI + 0xc) <= sVar13) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                                   (allocator<char> *)in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
                        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_890);
                        std::__cxx11::string::~string(local_890);
                        std::__cxx11::string::~string(local_8b0);
                        std::__cxx11::string::~string(local_8d0);
                        std::__cxx11::string::~string(local_8f0);
                        std::__cxx11::string::~string(local_910);
                        std::__cxx11::string::~string(local_930);
                        std::__cxx11::string::~string(local_998);
                        std::__cxx11::string::~string(local_950);
                        std::__cxx11::string::~string(local_970);
                        std::allocator<char>::~allocator(&local_971);
                        uVar4 = std::__cxx11::string::c_str();
                        SDL_LogError(1,"%s",uVar4);
                      }
                      BRDPart::BRDPart(in_stack_ffffffffffffea30);
                      local_a00 = &local_338;
                      local_9f8 = local_340;
                      local_9f0 = &local_2e8;
                      local_9e8 = &local_2f0;
                      local_9e0 = BRD2File::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT44(in_stack_ffffffffffffea24,
                                                      in_stack_ffffffffffffea20));
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_9ac = (undefined4)lVar8;
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_9a8 = (undefined4)lVar8;
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_9a4 = (undefined4)lVar8;
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_9a0 = (undefined4)lVar8;
                      local_a10 = &local_338;
                      local_9b0 = BRD2File::anon_class_16_2_d7082a65::operator()
                                            (in_stack_ffffffffffffeb60);
                      local_9b4 = 0;
                      local_a28 = &local_338;
                      local_a14 = BRD2File::anon_class_16_2_d7082a65::operator()
                                            (in_stack_ffffffffffffeb60);
                      if (local_a14 == 1) {
                        local_9b8 = 2;
                      }
                      else {
                        local_9b8 = (uint)(local_a14 == 2);
                      }
                      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                ((vector<BRDPart,_std::allocator<BRDPart>_> *)
                                 in_stack_ffffffffffffea30,
                                 (value_type *)
                                 CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28));
                      BRDPart::~BRDPart((BRDPart *)0x166efa);
                      break;
                    case 4:
                      sVar13 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                                         ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc))
                      ;
                      if (*(uint *)(in_RDI + 2) <= sVar13) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                                   (allocator<char> *)in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
                        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        in_stack_ffffffffffffeb60 = local_a48;
                        std::__cxx11::string::operator=
                                  ((string *)(in_RDI + 0x13),(string *)in_stack_ffffffffffffeb60);
                        std::__cxx11::string::~string((string *)in_stack_ffffffffffffeb60);
                        std::__cxx11::string::~string(local_a68);
                        std::__cxx11::string::~string(local_a88);
                        std::__cxx11::string::~string(local_aa8);
                        std::__cxx11::string::~string(local_ac8);
                        std::__cxx11::string::~string(local_ae8);
                        std::__cxx11::string::~string(local_b50);
                        std::__cxx11::string::~string(local_b08);
                        std::__cxx11::string::~string(local_b28);
                        std::allocator<char>::~allocator(&local_b29);
                        uVar4 = std::__cxx11::string::c_str();
                        SDL_LogError(1,"%s",uVar4);
                      }
                      BRDPin::BRDPin((BRDPin *)
                                     CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_b88 = (undefined4)lVar8;
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_b84 = (undefined4)lVar8;
                      local_ba0 = &local_338;
                      local_b8c = BRD2File::anon_class_16_2_d7082a65::operator()
                                            (in_stack_ffffffffffffeb60);
                      local_bb8 = &local_338;
                      local_ba4 = BRD2File::anon_class_16_2_d7082a65::operator()
                                            (in_stack_ffffffffffffeb60);
                      if (local_ba4 == 1) {
                        local_b78 = 2;
                      }
                      else {
                        local_b78 = (uint)(local_ba4 == 2);
                      }
                      ppcVar10 = std::
                                 unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                                 ::at((unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffea24,
                                                  in_stack_ffffffffffffea20),
                                      (key_type *)in_stack_ffffffffffffea18);
                      local_b70 = *ppcVar10;
                      local_b80 = 1;
                      local_b7c = 0;
                      std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                                ((vector<BRDPin,_std::allocator<BRDPin>_> *)
                                 in_stack_ffffffffffffea30,
                                 (value_type *)
                                 CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28));
                      break;
                    case 5:
                      sVar13 = std::vector<BRDNail,_std::allocator<BRDNail>_>::size
                                         ((vector<BRDNail,_std::allocator<BRDNail>_> *)
                                          (in_RDI + 0xf));
                      if (*(uint *)((long)in_RDI + 0x14) <= sVar13) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                                   (allocator<char> *)in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffea68 >> 0x20));
                        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffea2c,
                                                   in_stack_ffffffffffffea28),
                                       (char *)CONCAT44(in_stack_ffffffffffffea24,
                                                        in_stack_ffffffffffffea20));
                        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_be0);
                        std::__cxx11::string::~string(local_be0);
                        std::__cxx11::string::~string(local_c00);
                        std::__cxx11::string::~string(local_c20);
                        std::__cxx11::string::~string(local_c40);
                        std::__cxx11::string::~string(local_c60);
                        std::__cxx11::string::~string(local_c80);
                        std::__cxx11::string::~string(local_ce8);
                        std::__cxx11::string::~string(local_ca0);
                        std::__cxx11::string::~string(local_cc0);
                        std::allocator<char>::~allocator(&local_cc1);
                        uVar4 = std::__cxx11::string::c_str();
                        SDL_LogError(1,"%s",uVar4);
                      }
                      BRDNail::BRDNail((BRDNail *)
                                       CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20)
                                      );
                      local_d10 = &local_338;
                      local_d00 = BRD2File::anon_class_16_2_d7082a65::operator()
                                            (in_stack_ffffffffffffeb60);
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_cfc = (undefined4)lVar8;
                      lVar8 = strtol((char *)local_338,(char **)&local_338,10);
                      local_cf8 = (int)lVar8;
                      local_d28 = &local_338;
                      local_d14 = BRD2File::anon_class_16_2_d7082a65::operator()
                                            (in_stack_ffffffffffffeb60);
                      local_d30._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                           ::find(in_stack_ffffffffffffea18,(key_type *)0x1678ac);
                      local_d38._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                           ::end(in_stack_ffffffffffffea18);
                      bVar1 = std::__detail::operator!=(&local_d30,&local_d38);
                      if (bVar1) {
                        ppVar11 = std::__detail::
                                  _Node_iterator<std::pair<const_int,_char_*>,_false,_false>::
                                  operator->((_Node_iterator<std::pair<const_int,_char_*>,_false,_false>
                                              *)0x167903);
                        local_cf0 = ppVar11->second;
                      }
                      else {
                        local_cf0 = "UNCONNECTED";
                        poVar12 = std::operator<<((ostream *)&std::cerr,"Missing net id: ");
                        poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_d14);
                        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
                      }
                      local_d50 = &local_338;
                      uVar2 = BRD2File::anon_class_16_2_d7082a65::operator()
                                        (in_stack_ffffffffffffeb60);
                      local_d39 = uVar2 == 1;
                      if ((bool)local_d39) {
                        local_cf4 = 2;
                      }
                      else {
                        local_cf4 = 1;
                        local_cf8 = local_5c.y - local_cf8;
                      }
                      std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                                ((vector<BRDNail,_std::allocator<BRDNail>_> *)
                                 in_stack_ffffffffffffea30,
                                 (value_type *)
                                 CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28));
                    }
                  }
                }
              }
            }
          }
        }
        __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
        operator++(&local_320);
      }
      uVar2 = *(uint *)(in_RDI + 1);
      sVar13 = std::vector<BRDPoint,_std::allocator<BRDPoint>_>::size
                         ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)(in_RDI + 3));
      if (uVar2 != sVar13) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                   (allocator<char> *)in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::__cxx11::to_string(iVar3);
        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_d70);
        std::__cxx11::string::~string(local_d70);
        std::__cxx11::string::~string(local_d90);
        std::__cxx11::string::~string(local_db0);
        std::__cxx11::string::~string(local_dd0);
        std::__cxx11::string::~string(local_df0);
        std::__cxx11::string::~string(local_e10);
        std::__cxx11::string::~string(local_e78);
        std::__cxx11::string::~string(local_e30);
        std::__cxx11::string::~string(local_e50);
        std::allocator<char>::~allocator(&local_e51);
        uVar4 = std::__cxx11::string::c_str();
        SDL_LogError(1,"%s",uVar4);
      }
      uVar14 = (ulong)local_54;
      sVar15 = std::
               unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
               ::size((unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                       *)0x167db4);
      if (uVar14 != sVar15) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                   (allocator<char> *)in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::__cxx11::to_string(iVar3);
        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_e98);
        std::__cxx11::string::~string(local_e98);
        std::__cxx11::string::~string(local_eb8);
        std::__cxx11::string::~string(local_ed8);
        std::__cxx11::string::~string(local_ef8);
        std::__cxx11::string::~string(local_f18);
        std::__cxx11::string::~string(local_f38);
        std::__cxx11::string::~string(local_fa0);
        std::__cxx11::string::~string(local_f58);
        std::__cxx11::string::~string(local_f78);
        std::allocator<char>::~allocator(&local_f79);
        uVar4 = std::__cxx11::string::c_str();
        SDL_LogError(1,"%s",uVar4);
      }
      uVar2 = *(uint *)((long)in_RDI + 0xc);
      sVar13 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                         ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9));
      if (uVar2 != sVar13) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                   (allocator<char> *)in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::__cxx11::to_string(iVar3);
        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_fc0);
        std::__cxx11::string::~string(local_fc0);
        std::__cxx11::string::~string(local_fe0);
        std::__cxx11::string::~string(local_1000);
        std::__cxx11::string::~string(local_1020);
        std::__cxx11::string::~string(local_1040);
        std::__cxx11::string::~string(local_1060);
        std::__cxx11::string::~string((string *)(local_10e8 + 0x20));
        std::__cxx11::string::~string(local_1080);
        std::__cxx11::string::~string(local_10a0);
        std::allocator<char>::~allocator(&local_10a1);
        uVar4 = std::__cxx11::string::c_str();
        SDL_LogError(1,"%s",uVar4);
      }
      uVar2 = *(uint *)(in_RDI + 2);
      sVar13 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                         ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc));
      if (uVar2 != sVar13) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58,
                   (allocator<char> *)in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::__cxx11::to_string(iVar3);
        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        in_stack_ffffffffffffea70 = (BRDFileBase *)local_10e8;
        std::__cxx11::string::operator=
                  ((string *)(in_RDI + 0x13),(string *)in_stack_ffffffffffffea70);
        std::__cxx11::string::~string((string *)in_stack_ffffffffffffea70);
        std::__cxx11::string::~string(local_1108);
        std::__cxx11::string::~string(local_1128);
        std::__cxx11::string::~string(local_1148);
        std::__cxx11::string::~string(local_1168);
        std::__cxx11::string::~string(local_1188);
        std::__cxx11::string::~string(local_11f0);
        std::__cxx11::string::~string(local_11a8);
        std::__cxx11::string::~string(local_11c8);
        std::allocator<char>::~allocator(&local_11c9);
        uVar4 = std::__cxx11::string::c_str();
        SDL_LogError(1,"%s",uVar4);
      }
      uVar14 = (ulong)*(uint *)((long)in_RDI + 0x14);
      sVar13 = std::vector<BRDNail,_std::allocator<BRDNail>_>::size
                         ((vector<BRDNail,_std::allocator<BRDNail>_> *)(in_RDI + 0xf));
      if (uVar14 != sVar13) {
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12f1;
        std::allocator<char>::allocator();
        iVar3 = (int)(uVar14 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (this_01,(char *)in_stack_ffffffffffffea58,
                   (allocator<char> *)in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::__cxx11::to_string(iVar3);
        std::operator+(in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28),
                       (char *)CONCAT44(in_stack_ffffffffffffea24,in_stack_ffffffffffffea20));
        this_00 = local_1210;
        std::__cxx11::string::operator=((string *)(in_RDI + 0x13),this_00);
        std::__cxx11::string::~string(this_00);
        std::__cxx11::string::~string(local_1230);
        std::__cxx11::string::~string(local_1250);
        std::__cxx11::string::~string(local_1270);
        std::__cxx11::string::~string(local_1290);
        std::__cxx11::string::~string(local_12b0);
        std::__cxx11::string::~string(local_1318);
        std::__cxx11::string::~string(local_12d0);
        std::__cxx11::string::~string((string *)(local_12f1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_12f1);
        uVar4 = std::__cxx11::string::c_str();
        SDL_LogError(1,"%s",uVar4);
      }
      local_1320 = 0;
      for (local_1328 = (BRDPart *)0x0;
          pBVar16 = (BRDPart *)
                    std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9)),
          local_1328 < pBVar16;
          local_1328 = (BRDPart *)
                       ((long)&(((_Vector_base<BRDPoint,_std::allocator<BRDPoint>_> *)
                                &local_1328->name)->_M_impl).super__Vector_impl_data._M_start + 1))
      {
        bVar1 = true;
        pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                            ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                             (size_type)local_1328);
        if (pvVar17->mounting_side == Bottom) {
          iVar3 = local_5c.y;
          pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                               (size_type)local_1328);
          iVar3 = iVar3 - (pvVar17->p1).y;
          pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                               (size_type)local_1328);
          (pvVar17->p1).y = iVar3;
          iVar3 = local_5c.y;
          pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                               (size_type)local_1328);
          iVar3 = iVar3 - (pvVar17->p2).y;
          pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                               (size_type)local_1328);
          (pvVar17->p2).y = iVar3;
        }
        in_stack_ffffffffffffea30 = local_1328;
        sVar13 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                           ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9));
        if (in_stack_ffffffffffffea30 == (BRDPart *)(sVar13 - 1)) {
          sVar13 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                             ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc));
          local_131c = (uint)sVar13;
        }
        else {
          pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                               (size_type)
                               ((long)&(((_Vector_base<BRDPoint,_std::allocator<BRDPoint>_> *)
                                        &local_1328->name)->_M_impl).super__Vector_impl_data.
                                       _M_start + 1));
          local_131c = pvVar17->end_of_pins;
        }
        for (; local_1320 < (int)local_131c; local_1320 = local_1320 + 1) {
          in_stack_ffffffffffffea2c = (int)local_1328 + 1;
          pvVar18 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[]
                              ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc),
                               (long)local_1320);
          pvVar18->part = in_stack_ffffffffffffea2c;
          pvVar18 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[]
                              ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc),
                               (long)local_1320);
          if (pvVar18->side != Top) {
            in_stack_ffffffffffffea28 = local_5c.y;
            pvVar18 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[]
                                ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc),
                                 (long)local_1320);
            in_stack_ffffffffffffea28 = in_stack_ffffffffffffea28 - (pvVar18->pos).y;
            pvVar18 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[]
                                ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc),
                                 (long)local_1320);
            (pvVar18->pos).y = in_stack_ffffffffffffea28;
          }
          pvVar18 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[]
                              ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc),
                               (long)local_1320);
          if (((pvVar18->side == Top) &&
              (pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                                   ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                                    (size_type)local_1328), pvVar17->mounting_side == Top)) ||
             ((pvVar18 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[]
                                   ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc),
                                    (long)local_1320), pvVar18->side == Bottom &&
              (pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                                   ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                                    (size_type)local_1328), pvVar17->mounting_side == Bottom)))) {
            bVar1 = false;
          }
        }
        if (bVar1) {
          pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                               (size_type)local_1328);
          pvVar17->part_type = ThroughHole;
          pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                               (size_type)local_1328);
          pvVar17->mounting_side = Both;
        }
        else {
          pvVar17 = std::vector<BRDPart,_std::allocator<BRDPart>_>::operator[]
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9),
                               (size_type)local_1328);
          pvVar17->part_type = SMD;
        }
      }
      for (local_1330 = 1; local_1330 < 3; local_1330 = local_1330 + 1) {
        BRDPart::BRDPart(in_stack_ffffffffffffea30);
        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                  ((vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_ffffffffffffea30,
                   (value_type *)CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28));
        BRDPart::~BRDPart((BRDPart *)0x168efe);
      }
      BRDFileBase::AddNailsAsPins(in_stack_ffffffffffffea70);
      *(bool *)(in_RDI + 0x12) = local_2f4 != 0;
      std::vector<char_*,_std::allocator<char_*>_>::~vector
                ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffea30);
      local_19c = 0;
    }
  }
  std::
  unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
  ::~unordered_map((unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
                    *)0x168f87);
  return;
}

Assistant:

BRD2File::BRD2File(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	std::unordered_map<int, char *> nets; // Map between net id and net name
	unsigned int num_nets = 0;
	BRDPoint max{0, 0}; // Top-right board boundary

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	int current_block = 0;

	std::vector<char *>  lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (strstr(line, "BRDOUT:") == line) {
			current_block = 1;
			p += 7; // Skip "BRDOUT:"
			num_format = READ_UINT();
			max.x      = READ_INT();
			max.y      = READ_INT();
			continue;
		}
		if (strstr(line, "NETS:") == line) {
			current_block = 2;
			p += 5; // Skip "NETS:"
			num_nets = READ_UINT();
			continue;
		}
		if (strstr(line, "PARTS:") == line) {
			current_block = 3;
			p += 6; // Skip "PARTS:"
			num_parts = READ_UINT();
			continue;
		}
		if (strstr(line, "PINS:") == line) {
			current_block = 4;
			p += 5; // Skip "PINS:"
			num_pins = READ_UINT();
			continue;
		}
		if (strstr(line, "NAILS:") == line) {
			current_block = 5;
			p += 6; // Skip "NAILS:"
			num_nails = READ_UINT();
			continue;
		}

		switch (current_block) {
			case 1: { // Format
				ENSURE(format.size() < num_format, error_msg);
				BRDPoint point;
				point.x = READ_INT();
				point.y = READ_INT();
				ENSURE(point.x <= max.x, error_msg);
				ENSURE(point.y <= max.y, error_msg);
				format.push_back(point);
			} break;

			case 2: { // Nets
				ENSURE(nets.size() < num_nets, error_msg);
				int id   = READ_UINT();
				nets[id] = READ_STR();
			} break;

			case 3: { // PARTS
				ENSURE(parts.size() < num_parts, error_msg);
				BRDPart part;

				part.name        = READ_STR();
				part.p1.x        = READ_INT();
				part.p1.y        = READ_INT();
				part.p2.x        = READ_INT();
				part.p2.y        = READ_INT();
				part.end_of_pins = READ_UINT(); // Warning: not end but beginning in this format
				part.part_type   = BRDPartType::SMD;
				int side         = READ_UINT();
				if (side == 1)
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else if (side == 2)
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				else //0
					part.mounting_side = BRDPartMountingSide::Both;

				parts.push_back(part);
			} break;

			case 4: { // PINS
				ENSURE(pins.size() < num_pins, error_msg);
				BRDPin pin;

				pin.pos.x = READ_INT();
				pin.pos.y = READ_INT();
				int netid = READ_UINT();
				unsigned int side  = READ_UINT();
				if (side == 1)
					pin.side = BRDPinSide::Top;
				else if (side == 2)
					pin.side = BRDPinSide::Bottom;
				else //0
					pin.side = BRDPinSide::Both;

				try {
					pin.net = nets.at(netid);
				} catch (const std::out_of_range &e) {
					pin.net = "";
				}

				pin.probe = 1;
				pin.part  = 0;
				pins.push_back(pin);
			} break;

			case 5: { // NAILS
				ENSURE(nails.size() < num_nails, error_msg);
				BRDNail nail;

				nail.probe = READ_UINT();
				nail.pos.x = READ_INT();
				nail.pos.y = READ_INT();
				int netid  = READ_UINT();

				auto inet = nets.find(netid);
				if (inet != nets.end())
					nail.net = inet->second;
				else {
					nail.net = "UNCONNECTED";
					std::cerr << "Missing net id: " << netid << std::endl;
				}

				bool nail_is_top = READ_UINT() == 1;
				if (nail_is_top) {
					nail.side = BRDPartMountingSide::Top;
				} else {
					nail.side = BRDPartMountingSide::Bottom;
					nail.pos.y = max.y - nail.pos.y;
				}
				nails.push_back(nail);

			} break;
			default: continue;
		}
	}

	ENSURE(num_format == format.size(), error_msg);
	ENSURE(num_nets == nets.size(), error_msg);
	ENSURE(num_parts == parts.size(), error_msg);
	ENSURE(num_pins == pins.size(), error_msg);
	ENSURE(num_nails == nails.size(), error_msg);

	/*
	 * Postprocess the data.  Specifically we need to allocate
	 * pins to parts.  So with this it's easiest to just iterate
	 * through the parts and pick up the pins required
	 */
	{
		int pei;     // pin end index (part[i+1].pin# -1
		int cpi = 0; // current pin index
		for (decltype(parts)::size_type i = 0; i < parts.size(); i++) {
			bool isDIP = true;

			if (parts[i].mounting_side == BRDPartMountingSide::Bottom) { // Part on bottom
				parts[i].p1.y = max.y - parts[i].p1.y;
				parts[i].p2.y = max.y - parts[i].p2.y;
			}

			if (i == parts.size() - 1) {
				pei = pins.size();
			} else {
				pei = parts[i + 1].end_of_pins; // Again, not end of pins but beginning
			}

			while (cpi < pei) {
				pins[cpi].part                           = i + 1;
				if (pins[cpi].side != BRDPinSide::Top) pins[cpi].pos.y = max.y - pins[cpi].pos.y;
				if ((pins[cpi].side == BRDPinSide::Top && parts[i].mounting_side == BRDPartMountingSide::Top) ||
				    (pins[cpi].side == BRDPinSide::Bottom && parts[i].mounting_side == BRDPartMountingSide::Bottom)) {
					// Pins on the same side as the part
					isDIP = false;
				}
				cpi++;
			}

			if (isDIP) {
				// All pins are through hole so part is DIP
				parts[i].part_type     = BRDPartType::ThroughHole;
				parts[i].mounting_side = BRDPartMountingSide::Both;
			} else {
				parts[i].part_type = BRDPartType::SMD;
			}
		}
	}

	for (auto i = 1; i <= 2; i++) { // Add dummy parts for probe points on both sides
		BRDPart part;
		part.name = "...";
		part.mounting_side =
		    (i == 1 ? BRDPartMountingSide::Bottom : BRDPartMountingSide::Top); // First part is bottom, last is top.
		part.end_of_pins = 0;                                                  // Unused
		parts.push_back(part);
	}

	AddNailsAsPins();

	valid = current_block != 0;
}